

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_vtab_config(sqlite3 *db,int op,...)

{
  bool bVar1;
  undefined8 uVar2;
  u8 in_DL;
  int err_code;
  va_list ap;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (op == 1) {
    if (db->pVtabCtx != (VtabCtx *)0x0) {
      db->pVtabCtx->pVTable->bConstraint = in_DL;
      err_code = 0;
      bVar1 = true;
      goto LAB_001f7b01;
    }
    uVar2 = 0x1f105;
  }
  else {
    uVar2 = 0x1f10d;
  }
  bVar1 = false;
  err_code = 0x15;
  sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",uVar2,
              "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
LAB_001f7b01:
  if (!bVar1) {
    db->errCode = err_code;
    sqlite3ErrorFinish(db,err_code);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return err_code;
}

Assistant:

SQLITE_API int sqlite3_vtab_config(sqlite3 *db, int op, ...){
  va_list ap;
  int rc = SQLITE_OK;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  va_start(ap, op);
  switch( op ){
    case SQLITE_VTAB_CONSTRAINT_SUPPORT: {
      VtabCtx *p = db->pVtabCtx;
      if( !p ){
        rc = SQLITE_MISUSE_BKPT;
      }else{
        assert( p->pTab==0 || IsVirtual(p->pTab) );
        p->pVTable->bConstraint = (u8)va_arg(ap, int);
      }
      break;
    }
    default:
      rc = SQLITE_MISUSE_BKPT;
      break;
  }
  va_end(ap);

  if( rc!=SQLITE_OK ) sqlite3Error(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}